

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Vector3<float> args;
  array<float,_4> aVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  bool bVar9;
  int iVar10;
  uint64_t uVar11;
  float *pfVar12;
  TransportMode in_ESI;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *in_RDI;
  long *in_FS_OFFSET;
  float fVar13;
  Float FVar14;
  Float gPdf;
  undefined1 extraout_var [12];
  undefined1 in_ZMM0 [64];
  undefined1 auVar60 [56];
  undefined1 auVar16 [64];
  ulong uVar59;
  undefined1 auVar61 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_05 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  ulong extraout_XMM0_Qb;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var_07 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 extraout_var_04 [60];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 extraout_var_09 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  ulong extraout_XMM0_Qb_00;
  undefined1 extraout_var_10 [56];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 extraout_var_11 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 extraout_var_12 [56];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 extraout_var_00 [12];
  undefined1 auVar52 [64];
  undefined1 extraout_var_13 [56];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 extraout_var_14 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  float in_XMM1_Da;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar86 [60];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  Vector3<float> VVar87;
  SampledSpectrum SVar88;
  Float exitPDF_1;
  Float wt_2;
  SampledSpectrum fExit_1;
  BSDFSample bs_1;
  Point2f u_2;
  Float uc_2;
  Float wt_1;
  BSDFSample bs;
  Point2f u_1;
  Float uc_1;
  Float weight;
  Float exitPDF;
  SampledSpectrum fExit;
  PhaseFunctionSample ps;
  Float te;
  Float wt;
  Float zp;
  Float dz;
  Float sigma_t;
  Float q;
  int depth;
  HGPhaseFunction phase;
  Float z;
  Vector3f w;
  SampledSpectrum betaExit;
  SampledSpectrum beta;
  BSDFSample wis;
  BSDFSample wos;
  Point2f u;
  Float uc;
  int s;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  Float exitZ;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> nonExitInterface;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> exitInterface;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> enterInterface;
  bool enteredTop;
  SampledSpectrum f;
  SampledSpectrum *in_stack_fffffffffffff958;
  Float in_stack_fffffffffffff960;
  float in_stack_fffffffffffff964;
  SampledSpectrum *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  Float in_stack_fffffffffffff974;
  float in_stack_fffffffffffff980;
  Float in_stack_fffffffffffff984;
  Vector3f *in_stack_fffffffffffff988;
  float in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  Tuple3<pbrt::Vector3,_float> *this_00;
  float local_65c;
  Float in_stack_fffffffffffff9b0;
  float in_stack_fffffffffffff9b4;
  float in_stack_fffffffffffff9b8;
  float in_stack_fffffffffffff9c8;
  Float FVar89;
  undefined8 in_stack_fffffffffffff9d8;
  Vector3f *in_stack_fffffffffffff9e0;
  Vector3f *in_stack_fffffffffffff9e8;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *in_stack_fffffffffffff9f0;
  Vector3f *in_stack_fffffffffffff9f8;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *in_stack_fffffffffffffa00;
  BSDFSample local_560;
  float local_534;
  undefined8 local_530;
  float local_528;
  undefined8 local_520;
  float local_518;
  undefined8 local_510;
  float local_508;
  undefined8 local_500;
  float local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  float local_488;
  undefined8 local_47c;
  float local_474;
  undefined8 local_470;
  float local_468;
  undefined8 local_460;
  float local_458;
  Float local_454;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  BSDFSample local_414;
  float local_3e8;
  undefined8 local_3e4;
  undefined8 local_3dc;
  undefined8 local_3d4;
  undefined8 local_3cc;
  undefined8 local_3c4;
  undefined8 local_3bc;
  Float local_3b4;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  float local_398;
  Float local_394;
  undefined8 local_390;
  float local_388;
  undefined8 local_380;
  float local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  PhaseFunctionSample local_31c;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2cc;
  undefined8 local_2c4;
  undefined8 local_2bc;
  undefined8 local_2b4;
  undefined8 local_2ac;
  undefined8 local_2a4;
  undefined8 local_29c;
  undefined8 local_294;
  undefined8 local_28c;
  undefined8 local_284;
  Float local_27c;
  undefined8 local_278;
  float local_270;
  undefined8 local_264;
  float local_25c;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  Float local_238;
  _lambda_pbrt__StatsAccumulator___1_ local_221;
  float local_220;
  Float local_21c;
  undefined4 local_218;
  float local_214;
  float local_210;
  float local_20c;
  int local_208;
  HGPhaseFunction local_204;
  Float local_200;
  Tuple3<pbrt::Vector3,_float> local_1fc;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [24];
  float local_1a8;
  Float local_1a4;
  undefined8 local_19c;
  BSDFSample local_194;
  undefined8 local_170;
  float local_168;
  int local_164;
  undefined1 *local_160;
  ulong local_158;
  float local_150;
  ulong local_148;
  float local_140;
  Tuple3<pbrt::Vector3,_float> local_138;
  Tuple3<pbrt::Vector3,_float> local_128;
  undefined1 local_118 [20];
  undefined8 local_104;
  undefined8 local_fc;
  undefined8 local_f4;
  undefined8 local_ec;
  Float local_e4;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_e0;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_d0;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_c0;
  byte local_a9;
  ulong local_a8;
  float local_a0;
  ulong local_94;
  float local_8c;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined8 local_6c;
  undefined8 local_64;
  TransportMode local_5c;
  ulong local_4c;
  Vector3f local_3c;
  Tuple3<pbrt::Vector3,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_20 [2];
  undefined1 auVar15 [64];
  undefined1 extraout_var_03 [60];
  
  local_30._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_4c = vmovlpd_avx(in_ZMM2._0_16_);
  local_5c = in_ESI;
  local_3c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_4c;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.z = in_XMM3_Da;
  local_20[0]._0_8_ = local_30._0_8_;
  local_20[0].z = in_XMM1_Da;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
  if ((*(char *)((long)&in_RDI[4].bottom + 6) != '\0') &&
     (auVar60 = SUB6456(ZEXT1664((undefined1  [16])0x0),8), local_20[0].z < 0.0)) {
    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    local_88.z = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar60;
    local_88._0_8_ = vmovlpd_avx(auVar15._0_16_);
    local_78._0_8_ = local_88._0_8_;
    local_78.z = local_88.z;
    local_20[0]._0_8_ = local_88._0_8_;
    local_20[0].z = local_88.z;
    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    local_a0 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar60;
    local_a8 = vmovlpd_avx(auVar16._0_16_);
    local_94 = local_a8;
    local_8c = local_a0;
    local_3c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_a8;
    local_3c.super_Tuple3<pbrt::Vector3,_float>.z = local_a0;
  }
  auVar60 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_a9 = 0.0 < local_20[0].z;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::TopOrBottomBxDF(&local_c0);
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::TopOrBottomBxDF(&local_d0);
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::TopOrBottomBxDF(&local_e0);
  if ((local_a9 & 1) == 0) {
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_c0,(ConductorBxDF *)((long)&in_RDI->bottom + 4));
  }
  else {
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_c0,(DielectricInterfaceBxDF *)in_RDI);
  }
  bVar9 = SameHemisphere((Vector3f *)local_20,&local_3c);
  if (bVar9 == (bool)(local_a9 & 1)) {
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_d0,(DielectricInterfaceBxDF *)in_RDI);
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_e0,(ConductorBxDF *)((long)&in_RDI->bottom + 4));
  }
  else {
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_d0,(ConductorBxDF *)((long)&in_RDI->bottom + 4));
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_e0,(DielectricInterfaceBxDF *)in_RDI);
  }
  bVar9 = SameHemisphere((Vector3f *)local_20,&local_3c);
  if (bVar9 == (bool)(local_a9 & 1)) {
    FVar89 = ((TrowbridgeReitzDistribution *)((long)&in_RDI[3].top + 4))->alpha_x;
  }
  else {
    FVar89 = 0.0;
  }
  uVar59 = 0;
  local_e4 = FVar89;
  bVar9 = SameHemisphere((Vector3f *)local_20,&local_3c);
  if (bVar9) {
    in_stack_fffffffffffff9c8 = (float)*(byte *)((long)&in_RDI[4].bottom + 5);
    auVar61 = ZEXT856(uVar59);
    SVar88 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                        in_stack_fffffffffffff9e0,
                        (TransportMode)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
    auVar62._0_8_ = SVar88.values.values._8_8_;
    auVar62._8_56_ = auVar60;
    auVar17._0_8_ = SVar88.values.values._0_8_;
    auVar17._8_56_ = auVar61;
    auVar61 = (undefined1  [56])0x0;
    local_104 = vmovlpd_avx(auVar17._0_16_);
    local_fc = vmovlpd_avx(auVar62._0_16_);
    SVar88 = pbrt::operator*(in_stack_fffffffffffff964,in_stack_fffffffffffff958);
    auVar63._0_8_ = SVar88.values.values._8_8_;
    auVar63._8_56_ = auVar60;
    auVar18._0_8_ = SVar88.values.values._0_8_;
    auVar18._8_56_ = auVar61;
    local_f4 = vmovlpd_avx(auVar18._0_16_);
    local_ec = vmovlpd_avx(auVar63._0_16_);
    local_6c = local_f4;
    local_64 = local_ec;
  }
  GetOptions();
  local_128.z = local_20[0].z;
  local_128.x = local_20[0].x;
  local_128.y = local_20[0].y;
  local_138.z = local_20[0].z;
  local_138.x = local_20[0].x;
  local_138.y = local_20[0].y;
  VVar87.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff990;
  VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff988;
  uVar11 = Hash<int,pbrt::Vector3<float>>((int)in_stack_fffffffffffff974,VVar87);
  local_140 = local_3c.super_Tuple3<pbrt::Vector3,_float>.z;
  local_148._0_4_ = local_3c.super_Tuple3<pbrt::Vector3,_float>.x;
  local_148._4_4_ = local_3c.super_Tuple3<pbrt::Vector3,_float>.y;
  local_150 = local_3c.super_Tuple3<pbrt::Vector3,_float>.z;
  local_158._0_4_ = local_3c.super_Tuple3<pbrt::Vector3,_float>.x;
  local_158._4_4_ = local_3c.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar19 = ZEXT864((ulong)local_3c.super_Tuple3<pbrt::Vector3,_float>._0_8_);
  auVar64 = ZEXT464(0);
  args.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff990;
  args.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff988;
  Hash<pbrt::Vector3<float>>(args);
  RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
           (uint64_t)in_stack_fffffffffffff958,0x71e4c5);
  this_00 = (Tuple3<pbrt::Vector3,_float> *)
            CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990);
  local_160 = local_118;
  local_164 = 0;
  do {
    auVar60 = auVar64._8_56_;
    if ((int)(uint)*(byte *)((long)&in_RDI[4].bottom + 5) <= local_164) {
      auVar61 = ZEXT856(auVar19._8_8_);
      SVar88 = SampledSpectrum::operator/(in_stack_fffffffffffff968,in_stack_fffffffffffff964);
      auVar85._0_8_ = SVar88.values.values._8_8_;
      auVar85._8_56_ = auVar60;
      auVar58._0_8_ = SVar88.values.values._0_8_;
      auVar58._8_56_ = auVar61;
      uVar2 = vmovlpd_avx(auVar58._0_16_);
      uVar3 = vmovlpd_avx(auVar85._0_16_);
      aVar4.values[2] = (float)(int)uVar3;
      aVar4.values[3] = (float)(int)((ulong)uVar3 >> 0x20);
      aVar4.values[0] = (float)(int)uVar2;
      aVar4.values[1] = (float)(int)((ulong)uVar2 >> 0x20);
      return (array<float,_4>)(array<float,_4>)aVar4.values;
    }
    local_168 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    fVar13 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
             anon_class_8_1_ba1d750b::operator()
                       ((anon_class_8_1_ba1d750b *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::anon_class_8_1_ba1d750b::
    operator()((anon_class_8_1_ba1d750b *)
               CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    auVar5._60_4_ = 0;
    auVar5._0_60_ = extraout_var_01;
    auVar64 = ZEXT1664(SUB6416(auVar5 << 0x20,0));
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               (float)((ulong)in_stack_fffffffffffff958 >> 0x20),SUB84(in_stack_fffffffffffff958,0))
    ;
    auVar19 = ZEXT464(0);
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
              (in_RDI,(Vector3f *)CONCAT44(FVar89,in_stack_fffffffffffff9c8),(Float)(uVar11 >> 0x20)
               ,(Point2f *)CONCAT44(fVar13,in_stack_fffffffffffff9b8),
               (TransportMode)in_stack_fffffffffffff9b4,
               (BxDFReflTransFlags)in_stack_fffffffffffff9b0);
    bVar9 = BSDFSample::operator_cast_to_bool(&local_194);
    if (bVar9) {
      auVar19 = ZEXT464((uint)local_194.wi.super_Tuple3<pbrt::Vector3,_float>.z);
      auVar64 = ZEXT1664((undefined1  [16])0x0);
      if ((local_194.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
         (NAN(local_194.wi.super_Tuple3<pbrt::Vector3,_float>.z))) {
        local_168 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                    anon_class_8_1_ba1d750b::operator()
                              ((anon_class_8_1_ba1d750b *)
                               CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        in_stack_fffffffffffff9b4 =
             LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
             anon_class_8_1_ba1d750b::operator()
                       ((anon_class_8_1_ba1d750b *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::anon_class_8_1_ba1d750b
        ::operator()((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        auVar6._60_4_ = 0;
        auVar6._0_60_ = extraout_var_02;
        auVar64 = ZEXT1664(SUB6416(auVar6 << 0x20,0));
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                   (float)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   SUB84(in_stack_fffffffffffff958,0));
        local_170 = local_19c;
        in_stack_fffffffffffff9b8 = local_168;
        operator~(local_5c);
        auVar19 = ZEXT464(0);
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                  (in_RDI,(Vector3f *)CONCAT44(FVar89,in_stack_fffffffffffff9c8),
                   (Float)(uVar11 >> 0x20),(Point2f *)CONCAT44(fVar13,in_stack_fffffffffffff9b8),
                   (TransportMode)in_stack_fffffffffffff9b4,
                   (BxDFReflTransFlags)in_stack_fffffffffffff9b0);
        bVar9 = BSDFSample::operator_cast_to_bool((BSDFSample *)local_1c0);
        if (bVar9) {
          auVar19 = ZEXT464((uint)local_1a8);
          auVar64 = ZEXT1664((undefined1  [16])0x0);
          auVar60 = auVar64._8_56_;
          if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
            AbsCosTheta((Vector3f *)0x71e694);
            auVar61 = extraout_var_05;
            SVar88 = SampledSpectrum::operator*
                               ((SampledSpectrum *)
                                CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
            auVar65._0_8_ = SVar88.values.values._8_8_;
            auVar65._8_56_ = auVar60;
            auVar20._0_8_ = SVar88.values.values._0_8_;
            auVar20._8_56_ = auVar61;
            local_1e0 = vmovlpd_avx(auVar20._0_16_);
            local_1d8 = vmovlpd_avx(auVar65._0_16_);
            auVar61 = (undefined1  [56])0x0;
            SVar88 = SampledSpectrum::operator/(in_stack_fffffffffffff968,in_stack_fffffffffffff964)
            ;
            auVar66._0_8_ = SVar88.values.values._8_8_;
            auVar66._8_56_ = auVar60;
            auVar21._0_8_ = SVar88.values.values._0_8_;
            auVar21._8_56_ = auVar61;
            local_1d0 = vmovlpd_avx(auVar21._0_16_);
            local_1c8 = vmovlpd_avx(auVar66._0_16_);
            auVar61 = (undefined1  [56])0x0;
            SVar88 = SampledSpectrum::operator/(in_stack_fffffffffffff968,in_stack_fffffffffffff964)
            ;
            auVar64._0_8_ = SVar88.values.values._8_8_;
            auVar64._8_56_ = auVar60;
            auVar22._0_8_ = SVar88.values.values._0_8_;
            auVar22._8_56_ = auVar61;
            local_1f0 = vmovlpd_avx(auVar22._0_16_);
            local_1e8 = vmovlpd_avx(auVar64._0_16_);
            local_1fc.x = local_194.wi.super_Tuple3<pbrt::Vector3,_float>.x;
            local_1fc.y = local_194.wi.super_Tuple3<pbrt::Vector3,_float>.y;
            local_1fc.z = local_194.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            if ((local_a9 & 1) == 0) {
              in_stack_fffffffffffff9b0 = 0.0;
            }
            else {
              in_stack_fffffffffffff9b0 =
                   ((TrowbridgeReitzDistribution *)((long)&in_RDI[3].top + 4))->alpha_x;
            }
            auVar19 = ZEXT464((uint)*(Float *)&in_RDI[3].bottom);
            local_200 = in_stack_fffffffffffff9b0;
            HGPhaseFunction::HGPhaseFunction(&local_204,*(Float *)&in_RDI[3].bottom);
            for (local_208 = 0; auVar60 = auVar64._8_56_,
                local_208 < (int)(uint)*(byte *)((long)&in_RDI[4].bottom + 4);
                local_208 = local_208 + 1) {
              if (3 < local_208) {
                FVar14 = SampledSpectrum::MaxComponentValue
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                auVar60 = ZEXT856(extraout_XMM0_Qb);
                if (FVar14 < 0.25) {
                  local_210 = 0.0;
                  FVar14 = SampledSpectrum::MaxComponentValue
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  local_214 = 1.0 - FVar14;
                  pfVar12 = std::max<float>(&local_210,&local_214);
                  local_20c = *pfVar12;
                  auVar23._0_4_ =
                       LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                       anon_class_8_1_ba1d750b::operator()
                                 ((anon_class_8_1_ba1d750b *)
                                  CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  auVar23._4_60_ = extraout_var_03;
                  auVar64 = ZEXT1664(auVar23._0_16_);
                  auVar60 = ZEXT856(extraout_var_03._4_8_);
                  auVar19 = ZEXT464((uint)local_20c);
                  if (auVar23._0_4_ < local_20c) break;
                  SampledSpectrum::operator/=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                             (Float)((ulong)in_stack_fffffffffffff968 >> 0x20));
                }
              }
              bVar9 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff968);
              if (bVar9) {
                local_218 = 0x3f800000;
                LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                AbsCosTheta((Vector3f *)0x71e8b6);
                local_21c = SampleExponential(0.0,1.0460927e-38);
                auVar64 = ZEXT1664((undefined1  [16])0x0);
                if (local_1fc.z <= 0.0) {
                  local_65c = local_200 - local_21c;
                }
                else {
                  local_65c = local_200 + local_21c;
                }
                local_220 = local_65c;
                if (LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                    f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') {
                  iVar10 = __cxa_guard_acquire();
                  auVar64._8_56_ = extraout_var_15;
                  auVar64._0_8_ = extraout_XMM1_Qa;
                  if (iVar10 != 0) {
                    pbrt::LayeredBxDF::f(pbrt::Vector3,pbrt::Vector3,pbrt::TransportMode)_const::
                    {lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer
                              (&local_221);
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)this_00,(AccumFunc)in_stack_fffffffffffff988,
                               (PixelAccumFunc)
                               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                    __cxa_guard_release();
                    auVar64._8_56_ = extraout_var_16;
                    auVar64._0_8_ = extraout_XMM1_Qa_00;
                  }
                }
                *(long *)(*in_FS_OFFSET + -0x128) = *(long *)(*in_FS_OFFSET + -0x128) + 1;
                if ((local_200 == local_220) && (!NAN(local_200) && !NAN(local_220))) {
                  *(long *)(*in_FS_OFFSET + -0x130) = *(long *)(*in_FS_OFFSET + -0x130) + 1;
                }
                auVar19 = ZEXT464((uint)local_200);
                if ((local_200 != local_220) || (NAN(local_200) || NAN(local_220))) {
                  if ((local_220 <= 0.0) ||
                     (((TrowbridgeReitzDistribution *)((long)&in_RDI[3].top + 4))->alpha_x <=
                      local_220)) {
                    auVar60 = SUB6056((undefined1  [60])0x0,4);
                    local_200 = Clamp<float,int,float>
                                          (local_220,0,
                                           ((TrowbridgeReitzDistribution *)
                                           ((long)&in_RDI[3].top + 4))->alpha_x);
                    goto LAB_0071f092;
                  }
                  local_238 = 1.0;
                  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                            ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  bVar9 = IsSpecular(Unset);
                  FVar14 = local_1a4;
                  if (!bVar9) {
                    auVar60 = (undefined1  [56])0x0;
                    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    local_250 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar24._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar24._8_56_ = auVar60;
                    local_258 = vmovlpd_avx(auVar24._0_16_);
                    local_248 = local_258;
                    local_240 = local_250;
                    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    local_270 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar25._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar25._8_56_ = auVar60;
                    local_278 = vmovlpd_avx(auVar25._0_16_);
                    local_264 = local_278;
                    local_25c = local_270;
                    gPdf = HGPhaseFunction::PDF
                                     ((HGPhaseFunction *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (Vector3f *)in_stack_fffffffffffff958,(Vector3f *)0x71eb09);
                    local_238 = PowerHeuristic(1,FVar14,1,gPdf);
                  }
                  auVar61 = (undefined1  [56])0x0;
                  in_stack_fffffffffffff988 = (Vector3f *)(local_1c0 + 0x10);
                  local_27c = Tr(in_stack_fffffffffffff960,(Vector3f *)in_stack_fffffffffffff958);
                  auVar60 = extraout_var_06;
                  SVar88 = SampledSpectrum::operator*
                                     (in_stack_fffffffffffff968,
                                      (SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  auVar67._0_8_ = SVar88.values.values._8_8_;
                  auVar67._8_56_ = auVar61;
                  auVar26._0_8_ = SVar88.values.values._0_8_;
                  auVar26._8_56_ = auVar60;
                  local_2cc = vmovlpd_avx(auVar26._0_16_);
                  local_2c4 = vmovlpd_avx(auVar67._0_16_);
                  this_00 = &local_1fc;
                  VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  local_2e0 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar27._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar27._8_56_ = auVar60;
                  local_2e8 = vmovlpd_avx(auVar27._0_16_);
                  local_2d8 = local_2e8;
                  local_2d0 = local_2e0;
                  VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  local_300 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar28._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar28._8_56_ = auVar60;
                  local_308 = vmovlpd_avx(auVar28._0_16_);
                  local_2f8 = local_308;
                  local_2f0 = local_300;
                  HGPhaseFunction::p((HGPhaseFunction *)
                                     CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                     (Vector3f *)in_stack_fffffffffffff968,
                                     (Vector3f *)
                                     CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  auVar60 = extraout_var_07;
                  SVar88 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                  auVar68._0_8_ = SVar88.values.values._8_8_;
                  auVar68._8_56_ = auVar61;
                  auVar29._0_8_ = SVar88.values.values._0_8_;
                  auVar29._8_56_ = auVar60;
                  local_2bc = vmovlpd_avx(auVar29._0_16_);
                  local_2b4 = vmovlpd_avx(auVar68._0_16_);
                  auVar60 = (undefined1  [56])0x0;
                  SVar88 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                  auVar69._0_8_ = SVar88.values.values._8_8_;
                  auVar69._8_56_ = auVar61;
                  auVar30._0_8_ = SVar88.values.values._0_8_;
                  auVar30._8_56_ = auVar60;
                  local_2ac = vmovlpd_avx(auVar30._0_16_);
                  local_2a4 = vmovlpd_avx(auVar69._0_16_);
                  auVar60 = (undefined1  [56])0x0;
                  SVar88 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                  auVar70._0_8_ = SVar88.values.values._8_8_;
                  auVar70._8_56_ = auVar61;
                  auVar31._0_8_ = SVar88.values.values._0_8_;
                  auVar31._8_56_ = auVar60;
                  local_29c = vmovlpd_avx(auVar31._0_16_);
                  local_294 = vmovlpd_avx(auVar70._0_16_);
                  SVar88 = SampledSpectrum::operator*
                                     (in_stack_fffffffffffff968,
                                      (SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  auVar71._0_8_ = SVar88.values.values._8_8_;
                  auVar71._8_56_ = auVar61;
                  auVar32._0_8_ = SVar88.values.values._0_8_;
                  auVar32._8_56_ = auVar60;
                  local_28c = vmovlpd_avx(auVar32._0_16_);
                  local_284 = vmovlpd_avx(auVar71._0_16_);
                  SampledSpectrum::operator+=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                             in_stack_fffffffffffff968);
                  VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  local_330 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar33._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar33._8_56_ = auVar60;
                  local_338 = vmovlpd_avx(auVar33._0_16_);
                  local_328 = local_338;
                  local_320 = local_330;
                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  auVar7._60_4_ = 0;
                  auVar7._0_60_ = extraout_var_04;
                  auVar64 = ZEXT1664(SUB6416(auVar7 << 0x20,0));
                  auVar19 = ZEXT464(0);
                  Point2<float>::Point2
                            ((Point2<float> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                             (float)((ulong)in_stack_fffffffffffff958 >> 0x20),
                             SUB84(in_stack_fffffffffffff958,0));
                  HGPhaseFunction::Sample_p
                            ((HGPhaseFunction *)this_00,in_stack_fffffffffffff988,
                             (Point2f *)
                             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                  bVar9 = PhaseFunctionSample::operator_cast_to_bool(&local_31c);
                  if (bVar9) {
                    auVar19 = ZEXT464((uint)local_31c.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                    auVar64 = ZEXT1664((undefined1  [16])0x0);
                    auVar60 = auVar64._8_56_;
                    if ((local_31c.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
                       (NAN(local_31c.wi.super_Tuple3<pbrt::Vector3,_float>.z))) {
                      auVar61 = (undefined1  [56])0x0;
                      SVar88 = SampledSpectrum::operator*
                                         ((SampledSpectrum *)
                                          CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960),
                                          (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                      auVar72._0_8_ = SVar88.values.values._8_8_;
                      auVar72._8_56_ = auVar60;
                      auVar34._0_8_ = SVar88.values.values._0_8_;
                      auVar34._8_56_ = auVar61;
                      local_360 = vmovlpd_avx(auVar34._0_16_);
                      local_358 = vmovlpd_avx(auVar72._0_16_);
                      auVar61 = (undefined1  [56])0x0;
                      SVar88 = SampledSpectrum::operator/
                                         (in_stack_fffffffffffff968,in_stack_fffffffffffff964);
                      auVar64._0_8_ = SVar88.values.values._8_8_;
                      auVar64._8_56_ = auVar60;
                      auVar35._0_8_ = SVar88.values.values._0_8_;
                      auVar35._8_56_ = auVar61;
                      local_350 = vmovlpd_avx(auVar35._0_16_);
                      local_348 = vmovlpd_avx(auVar64._0_16_);
                      SampledSpectrum::operator*=
                                ((SampledSpectrum *)
                                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                 in_stack_fffffffffffff968);
                      local_1fc.x = local_31c.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                      local_1fc.y = local_31c.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                      local_1fc.z = local_31c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar19 = ZEXT464((uint)local_220);
                      local_200 = local_220;
                      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                  *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                      bVar9 = IsSpecular(Unset);
                      auVar61 = auVar64._8_56_;
                      auVar60 = auVar19._8_56_;
                      if (!bVar9) {
                        VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                           ((Tuple3<pbrt::Vector3,_float> *)
                                            CONCAT44(in_stack_fffffffffffff964,
                                                     in_stack_fffffffffffff960));
                        local_388 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar36._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar36._8_56_ = auVar60;
                        local_390 = vmovlpd_avx(auVar36._0_16_);
                        local_380 = local_390;
                        local_378 = local_388;
                        SVar88 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::f(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                                     in_stack_fffffffffffff9e0,
                                     (TransportMode)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
                        auVar64._0_8_ = SVar88.values.values._8_8_;
                        auVar64._8_56_ = auVar61;
                        auVar19._0_8_ = SVar88.values.values._0_8_;
                        auVar19._8_56_ = auVar60;
                        local_370 = vmovlpd_avx(auVar19._0_16_);
                        local_368 = vmovlpd_avx(auVar64._0_16_);
                        bVar9 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff968);
                        auVar60 = auVar19._8_56_;
                        if (bVar9) {
                          VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                             ((Tuple3<pbrt::Vector3,_float> *)
                                              CONCAT44(in_stack_fffffffffffff964,
                                                       in_stack_fffffffffffff960));
                          local_3a8 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                          auVar37._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          auVar37._8_56_ = auVar60;
                          local_3b0 = vmovlpd_avx(auVar37._0_16_);
                          local_3a0 = local_3b0;
                          local_398 = local_3a8;
                          local_394 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                      ::PDF(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                            (Vector3f *)in_stack_fffffffffffff9f0,
                                            (TransportMode)
                                            ((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                            (BxDFReflTransFlags)in_stack_fffffffffffff9e8);
                          local_3b4 = PowerHeuristic(1,local_31c.pdf,1,local_394);
                          auVar61 = (undefined1  [56])0x0;
                          Tr(in_stack_fffffffffffff960,(Vector3f *)in_stack_fffffffffffff958);
                          auVar60 = extraout_var_08;
                          SVar88 = SampledSpectrum::operator*
                                             ((SampledSpectrum *)
                                              CONCAT44(in_stack_fffffffffffff964,
                                                       in_stack_fffffffffffff960),
                                              (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                          auVar73._0_8_ = SVar88.values.values._8_8_;
                          auVar73._8_56_ = auVar61;
                          auVar38._0_8_ = SVar88.values.values._0_8_;
                          auVar38._8_56_ = auVar60;
                          local_3e4 = vmovlpd_avx(auVar38._0_16_);
                          local_3dc = vmovlpd_avx(auVar73._0_16_);
                          SVar88 = SampledSpectrum::operator*
                                             (in_stack_fffffffffffff968,
                                              (SampledSpectrum *)
                                              CONCAT44(in_stack_fffffffffffff964,
                                                       in_stack_fffffffffffff960));
                          auVar74._0_8_ = SVar88.values.values._8_8_;
                          auVar74._8_56_ = auVar61;
                          auVar39._0_8_ = SVar88.values.values._0_8_;
                          auVar39._8_56_ = auVar60;
                          local_3d4 = vmovlpd_avx(auVar39._0_16_);
                          local_3cc = vmovlpd_avx(auVar74._0_16_);
                          auVar60 = (undefined1  [56])0x0;
                          SVar88 = SampledSpectrum::operator*
                                             ((SampledSpectrum *)
                                              CONCAT44(in_stack_fffffffffffff964,
                                                       in_stack_fffffffffffff960),
                                              (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                          auVar64._0_8_ = SVar88.values.values._8_8_;
                          auVar64._8_56_ = auVar61;
                          auVar19._0_8_ = SVar88.values.values._0_8_;
                          auVar19._8_56_ = auVar60;
                          local_3c4 = vmovlpd_avx(auVar19._0_16_);
                          local_3bc = vmovlpd_avx(auVar64._0_16_);
                          SampledSpectrum::operator+=
                                    ((SampledSpectrum *)
                                     CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                     in_stack_fffffffffffff968);
                        }
                      }
                    }
                  }
                }
              }
              else {
                fVar1 = ((TrowbridgeReitzDistribution *)((long)&in_RDI[3].top + 4))->alpha_x;
                if ((local_200 != fVar1) || (NAN(local_200) || NAN(fVar1))) {
                  in_stack_fffffffffffff984 =
                       ((TrowbridgeReitzDistribution *)((long)&in_RDI[3].top + 4))->alpha_x;
                }
                else {
                  in_stack_fffffffffffff984 = 0.0;
                }
                local_200 = in_stack_fffffffffffff984;
                Tr(in_stack_fffffffffffff960,(Vector3f *)in_stack_fffffffffffff958);
                SampledSpectrum::operator*=
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           (Float)((ulong)in_stack_fffffffffffff968 >> 0x20));
LAB_0071f092:
                if ((local_200 != local_e4) || (NAN(local_200) || NAN(local_e4))) {
                  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                            ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  bVar9 = IsSpecular(Unset);
                  if (!bVar9) {
                    auVar61 = (undefined1  [56])0x0;
                    local_454 = 1.0;
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                              ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                    bVar9 = IsSpecular(Unset);
                    if (!bVar9) {
                      auVar60 = (undefined1  [56])0x0;
                      in_stack_fffffffffffff974 = local_1a4;
                      VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                         ((Tuple3<pbrt::Vector3,_float> *)
                                          CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960));
                      local_468 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar42._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar42._8_56_ = auVar60;
                      local_470 = vmovlpd_avx(auVar42._0_16_);
                      local_460 = local_470;
                      local_458 = local_468;
                      VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                         ((Tuple3<pbrt::Vector3,_float> *)
                                          CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960));
                      local_488 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar43._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar43._8_56_ = auVar60;
                      local_490 = vmovlpd_avx(auVar43._0_16_);
                      local_47c = local_490;
                      local_474 = local_488;
                      FVar14 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               PDF(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                   (Vector3f *)in_stack_fffffffffffff9f0,
                                   (TransportMode)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                   (BxDFReflTransFlags)in_stack_fffffffffffff9e8);
                      auVar60 = ZEXT856(extraout_XMM0_Qb_00);
                      local_454 = PowerHeuristic(1,in_stack_fffffffffffff974,1,FVar14);
                      auVar61 = extraout_var_10;
                    }
                    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    local_508 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar44._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar44._8_56_ = auVar61;
                    local_510 = vmovlpd_avx(auVar44._0_16_);
                    in_stack_fffffffffffff968 = (SampledSpectrum *)(local_1c0 + 0x10);
                    local_500 = local_510;
                    local_4f8 = local_508;
                    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    local_528 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar45._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar45._8_56_ = auVar61;
                    local_530 = vmovlpd_avx(auVar45._0_16_);
                    local_520 = local_530;
                    local_518 = local_528;
                    SVar88 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                                        in_stack_fffffffffffff9e0,
                                        (TransportMode)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
                    auVar76._0_8_ = SVar88.values.values._8_8_;
                    auVar76._8_56_ = auVar60;
                    auVar46._0_8_ = SVar88.values.values._0_8_;
                    auVar46._8_56_ = auVar61;
                    local_4f0 = vmovlpd_avx(auVar46._0_16_);
                    local_4e8 = vmovlpd_avx(auVar76._0_16_);
                    SVar88 = SampledSpectrum::operator*
                                       (in_stack_fffffffffffff968,
                                        (SampledSpectrum *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    auVar77._0_8_ = SVar88.values.values._8_8_;
                    auVar77._8_56_ = auVar60;
                    auVar47._0_8_ = SVar88.values.values._0_8_;
                    auVar47._8_56_ = auVar61;
                    local_4e0 = vmovlpd_avx(auVar47._0_16_);
                    local_4d8 = vmovlpd_avx(auVar77._0_16_);
                    AbsCosTheta((Vector3f *)0x71f446);
                    auVar61 = extraout_var_11;
                    SVar88 = SampledSpectrum::operator*
                                       ((SampledSpectrum *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ),(Float)((ulong)in_stack_fffffffffffff958 >> 0x20))
                    ;
                    auVar78._0_8_ = SVar88.values.values._8_8_;
                    auVar78._8_56_ = auVar60;
                    auVar48._0_8_ = SVar88.values.values._0_8_;
                    auVar48._8_56_ = auVar61;
                    local_4d0 = vmovlpd_avx(auVar48._0_16_);
                    local_4c8 = vmovlpd_avx(auVar78._0_16_);
                    auVar61 = (undefined1  [56])0x0;
                    SVar88 = SampledSpectrum::operator*
                                       ((SampledSpectrum *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ),(Float)((ulong)in_stack_fffffffffffff958 >> 0x20))
                    ;
                    auVar79._0_8_ = SVar88.values.values._8_8_;
                    auVar79._8_56_ = auVar60;
                    auVar49._0_8_ = SVar88.values.values._0_8_;
                    auVar49._8_56_ = auVar61;
                    local_4c0 = vmovlpd_avx(auVar49._0_16_);
                    local_4b8 = vmovlpd_avx(auVar79._0_16_);
                    Tr(in_stack_fffffffffffff960,(Vector3f *)in_stack_fffffffffffff958);
                    auVar61 = extraout_var_12;
                    SVar88 = SampledSpectrum::operator*
                                       ((SampledSpectrum *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ),(Float)((ulong)in_stack_fffffffffffff958 >> 0x20))
                    ;
                    auVar80._0_8_ = SVar88.values.values._8_8_;
                    auVar80._8_56_ = auVar60;
                    auVar50._0_8_ = SVar88.values.values._0_8_;
                    auVar50._8_56_ = auVar61;
                    local_4b0 = vmovlpd_avx(auVar50._0_16_);
                    local_4a8 = vmovlpd_avx(auVar80._0_16_);
                    SVar88 = SampledSpectrum::operator*
                                       (in_stack_fffffffffffff968,
                                        (SampledSpectrum *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    auVar81._0_8_ = SVar88.values.values._8_8_;
                    auVar81._8_56_ = auVar60;
                    auVar51._0_8_ = SVar88.values.values._0_8_;
                    auVar51._8_56_ = auVar61;
                    local_4a0 = vmovlpd_avx(auVar51._0_16_);
                    local_498 = vmovlpd_avx(auVar81._0_16_);
                    SampledSpectrum::operator+=
                              ((SampledSpectrum *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                               in_stack_fffffffffffff968);
                  }
                  in_stack_fffffffffffff958 = (SampledSpectrum *)&local_160;
                  local_534 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                              anon_class_8_1_ba1d750b::operator()
                                        ((anon_class_8_1_ba1d750b *)
                                         CONCAT44(in_stack_fffffffffffff964,
                                                  in_stack_fffffffffffff960));
                  in_stack_fffffffffffff964 =
                       LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                       anon_class_8_1_ba1d750b::operator()
                                 ((anon_class_8_1_ba1d750b *)
                                  CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  auVar86 = ZEXT1260(extraout_var_00);
                  auVar60 = (undefined1  [56])0x0;
                  Point2<float>::Point2
                            ((Point2<float> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                             (float)((ulong)in_stack_fffffffffffff958 >> 0x20),
                             SUB84(in_stack_fffffffffffff958,0));
                  VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  auVar8._60_4_ = 0;
                  auVar8._0_60_ = auVar86;
                  auVar64 = auVar8 << 0x20;
                  auVar52._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar52._8_56_ = auVar60;
                  vmovlpd_avx(auVar52._0_16_);
                  auVar19 = ZEXT464(0);
                  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                            (in_RDI,(Vector3f *)CONCAT44(FVar89,in_stack_fffffffffffff9c8),
                             (Float)(uVar11 >> 0x20),
                             (Point2f *)CONCAT44(fVar13,in_stack_fffffffffffff9b8),
                             (TransportMode)in_stack_fffffffffffff9b4,
                             (BxDFReflTransFlags)in_stack_fffffffffffff9b0);
                  bVar9 = BSDFSample::operator_cast_to_bool(&local_560);
                  if (!bVar9) break;
                  auVar19 = ZEXT464((uint)local_560.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                  auVar64 = ZEXT1664((undefined1  [16])0x0);
                  auVar60 = auVar64._8_56_;
                  if ((local_560.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
                     (!NAN(local_560.wi.super_Tuple3<pbrt::Vector3,_float>.z))) break;
                  AbsCosTheta((Vector3f *)0x71f5f8);
                  auVar61 = extraout_var_13;
                  SVar88 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                  auVar82._0_8_ = SVar88.values.values._8_8_;
                  auVar82._8_56_ = auVar60;
                  auVar53._0_8_ = SVar88.values.values._0_8_;
                  auVar53._8_56_ = auVar61;
                  vmovlpd_avx(auVar53._0_16_);
                  vmovlpd_avx(auVar82._0_16_);
                  auVar61 = (undefined1  [56])0x0;
                  SVar88 = SampledSpectrum::operator/
                                     (in_stack_fffffffffffff968,in_stack_fffffffffffff964);
                  auVar64._0_8_ = SVar88.values.values._8_8_;
                  auVar64._8_56_ = auVar60;
                  auVar19._0_8_ = SVar88.values.values._0_8_;
                  auVar19._8_56_ = auVar61;
                  vmovlpd_avx(auVar19._0_16_);
                  vmovlpd_avx(auVar64._0_16_);
                  SampledSpectrum::operator*=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                             in_stack_fffffffffffff968);
                  local_1fc.x = local_560.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  local_1fc.y = local_560.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  local_1fc.z = local_560.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                            ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  bVar9 = IsSpecular(Unset);
                  auVar61 = auVar64._8_56_;
                  auVar60 = auVar19._8_56_;
                  if (!bVar9) {
                    VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ));
                    auVar54._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar54._8_56_ = auVar60;
                    vmovlpd_avx(auVar54._0_16_);
                    SVar88 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                                        in_stack_fffffffffffff9e0,
                                        (TransportMode)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
                    auVar64._0_8_ = SVar88.values.values._8_8_;
                    auVar64._8_56_ = auVar61;
                    auVar19._0_8_ = SVar88.values.values._0_8_;
                    auVar19._8_56_ = auVar60;
                    vmovlpd_avx(auVar19._0_16_);
                    vmovlpd_avx(auVar64._0_16_);
                    bVar9 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff968);
                    auVar60 = auVar64._8_56_;
                    if (bVar9) {
                      auVar61 = (undefined1  [56])0x0;
                      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                  *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                      bVar9 = IsSpecular(Unset);
                      if (!bVar9) {
                        VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                           ((Tuple3<pbrt::Vector3,_float> *)
                                            CONCAT44(in_stack_fffffffffffff964,
                                                     in_stack_fffffffffffff960));
                        auVar55._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar55._8_56_ = auVar61;
                        vmovlpd_avx(auVar55._0_16_);
                        FVar14 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::PDF(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                       (Vector3f *)in_stack_fffffffffffff9f0,
                                       (TransportMode)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                       (BxDFReflTransFlags)in_stack_fffffffffffff9e8);
                        auVar60 = (undefined1  [56])0x0;
                        PowerHeuristic(1,local_560.pdf,1,FVar14);
                      }
                      Tr(in_stack_fffffffffffff960,(Vector3f *)in_stack_fffffffffffff958);
                      auVar61 = extraout_var_14;
                      SVar88 = SampledSpectrum::operator*
                                         ((SampledSpectrum *)
                                          CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960),
                                          (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                      auVar83._0_8_ = SVar88.values.values._8_8_;
                      auVar83._8_56_ = auVar60;
                      auVar56._0_8_ = SVar88.values.values._0_8_;
                      auVar56._8_56_ = auVar61;
                      in_stack_fffffffffffff9d8 = vmovlpd_avx(auVar56._0_16_);
                      in_stack_fffffffffffff9e0 = (Vector3f *)vmovlpd_avx(auVar83._0_16_);
                      SVar88 = SampledSpectrum::operator*
                                         (in_stack_fffffffffffff968,
                                          (SampledSpectrum *)
                                          CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960));
                      auVar84._0_8_ = SVar88.values.values._8_8_;
                      auVar84._8_56_ = auVar60;
                      auVar57._0_8_ = SVar88.values.values._0_8_;
                      auVar57._8_56_ = auVar61;
                      in_stack_fffffffffffff9e8 = (Vector3f *)vmovlpd_avx(auVar57._0_16_);
                      in_stack_fffffffffffff9f0 =
                           (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                           vmovlpd_avx(auVar84._0_16_);
                      auVar61 = (undefined1  [56])0x0;
                      SVar88 = SampledSpectrum::operator*
                                         ((SampledSpectrum *)
                                          CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960),
                                          (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                      auVar64._0_8_ = SVar88.values.values._8_8_;
                      auVar64._8_56_ = auVar60;
                      auVar19._0_8_ = SVar88.values.values._0_8_;
                      auVar19._8_56_ = auVar61;
                      in_stack_fffffffffffff9f8 = (Vector3f *)vmovlpd_avx(auVar19._0_16_);
                      in_stack_fffffffffffffa00 =
                           (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                           vmovlpd_avx(auVar64._0_16_);
                      SampledSpectrum::operator+=
                                ((SampledSpectrum *)
                                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                 in_stack_fffffffffffff968);
                    }
                  }
                }
                else {
                  local_3e8 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                              anon_class_8_1_ba1d750b::operator()
                                        ((anon_class_8_1_ba1d750b *)
                                         CONCAT44(in_stack_fffffffffffff964,
                                                  in_stack_fffffffffffff960));
                  in_stack_fffffffffffff980 =
                       LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                       anon_class_8_1_ba1d750b::operator()
                                 ((anon_class_8_1_ba1d750b *)
                                  CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
                  auVar86 = ZEXT1260(extraout_var);
                  auVar60 = (undefined1  [56])0x0;
                  Point2<float>::Point2
                            ((Point2<float> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                             (float)((ulong)in_stack_fffffffffffff958 >> 0x20),
                             SUB84(in_stack_fffffffffffff958,0));
                  VVar87 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
                  ;
                  auVar64._0_4_ = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar64._4_60_ = auVar86;
                  auVar40._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar40._8_56_ = auVar60;
                  local_430 = vmovlpd_avx(auVar40._0_16_);
                  auVar19 = ZEXT464(0);
                  local_428 = auVar64._0_4_;
                  local_420 = local_430;
                  local_418 = auVar64._0_4_;
                  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                            (in_RDI,(Vector3f *)CONCAT44(FVar89,in_stack_fffffffffffff9c8),
                             (Float)(uVar11 >> 0x20),
                             (Point2f *)CONCAT44(fVar13,in_stack_fffffffffffff9b8),
                             (TransportMode)in_stack_fffffffffffff9b4,
                             (BxDFReflTransFlags)in_stack_fffffffffffff9b0);
                  bVar9 = BSDFSample::operator_cast_to_bool(&local_414);
                  if (!bVar9) break;
                  auVar19 = ZEXT464((uint)local_414.pdf);
                  auVar64 = ZEXT1664((undefined1  [16])0x0);
                  if ((local_414.pdf == 0.0) && (!NAN(local_414.pdf))) break;
                  auVar19 = ZEXT464((uint)local_414.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                  auVar64 = ZEXT1664((undefined1  [16])0x0);
                  auVar60 = auVar64._8_56_;
                  if ((local_414.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
                     (!NAN(local_414.wi.super_Tuple3<pbrt::Vector3,_float>.z))) break;
                  AbsCosTheta((Vector3f *)0x71f1c6);
                  auVar61 = extraout_var_09;
                  SVar88 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (Float)((ulong)in_stack_fffffffffffff958 >> 0x20));
                  auVar75._0_8_ = SVar88.values.values._8_8_;
                  auVar75._8_56_ = auVar60;
                  auVar41._0_8_ = SVar88.values.values._0_8_;
                  auVar41._8_56_ = auVar61;
                  local_450 = vmovlpd_avx(auVar41._0_16_);
                  local_448 = vmovlpd_avx(auVar75._0_16_);
                  auVar61 = (undefined1  [56])0x0;
                  SVar88 = SampledSpectrum::operator/
                                     (in_stack_fffffffffffff968,in_stack_fffffffffffff964);
                  auVar64._0_8_ = SVar88.values.values._8_8_;
                  auVar64._8_56_ = auVar60;
                  auVar19._0_8_ = SVar88.values.values._0_8_;
                  auVar19._8_56_ = auVar61;
                  local_440 = vmovlpd_avx(auVar19._0_16_);
                  local_438 = vmovlpd_avx(auVar64._0_16_);
                  SampledSpectrum::operator*=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                             in_stack_fffffffffffff968);
                  local_1fc.x = local_414.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  local_1fc.y = local_414.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  local_1fc.z = local_414.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                }
              }
            }
          }
        }
      }
    }
    local_164 = local_164 + 1;
  } while( true );
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance and exit interfaces for layered BSDF
        bool enteredTop = wo.z > 0;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface, exitInterface;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> nonExitInterface;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample wos = enterInterface.Sample_f(wo, uc, u, mode,
                                                     BxDFReflTransFlags::Transmission);
            if (!wos || wos.wi.z == 0)
                continue;

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            u = Point2f(r(), r());
            BSDFSample wis = exitInterface.Sample_f(wi, uc, u, ~mode,
                                                    BxDFReflTransFlags::Transmission);
            if (!wis || wis.wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos.f * AbsCosTheta(wos.wi) / wos.pdf;
            SampledSpectrum betaExit = wis.f / wis.pdf;
            Vector3f w = wos.wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < .25) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                if (albedo) {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//beta *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
beta *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
beta /= AbsCosTheta(w);
#endif
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1, phase.PDF(-w, -wis.wi));
                        Float te = Tr(zp - exitZ, wis.wi);
                        f += beta * albedo * phase.p(-w, -wis.wi) * wt * te * betaExit;

                        // Sample phase function and update layered path state
                        PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps.wi.z == 0)
                            continue;
                        beta *= albedo * ps.p / ps.pdf;
                        w = ps.wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps.pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps.wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);

                } else {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);
                }
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = exitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.pdf == 0 || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1,
                                                nonExitInterface.PDF(-w, -wis.wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis.wi, mode) *
                             AbsCosTheta(wis.wi) * wt * Tr(thickness, wis.wi) * betaExit;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs.pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs.wi) * fExit * wt;
                        }
                    }
                }
            }
        }
        return f / config.nSamples;
    }